

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

UniquePtr<X509> MakeTestCert(EVP_PKEY *key)

{
  bool bVar1;
  int iVar2;
  X509 *pXVar3;
  X509_NAME *name;
  pointer pxVar4;
  ASN1_TIME *pAVar5;
  ASN1_TIME *pAVar6;
  EVP_MD *md;
  __uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true> in_RSI;
  X509_NAME *subject;
  unique_ptr<x509_st,_bssl::internal::Deleter> local_20;
  UniquePtr<X509> x509;
  EVP_PKEY *key_local;
  
  x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_x509_st_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
       in_RSI.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
  pXVar3 = X509_new();
  std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<x509_st,bssl::internal::Deleter> *)&local_20,(pointer)pXVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar1) {
    pXVar3 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
    name = X509_get_subject_name(pXVar3);
    pxVar4 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
    pAVar5 = X509_get_notBefore(pxVar4);
    pAVar6 = X509_gmtime_adj((ASN1_TIME *)pAVar5,0);
    if (pAVar6 != (ASN1_TIME *)0x0) {
      pxVar4 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
      pAVar5 = X509_get_notAfter(pxVar4);
      pAVar6 = X509_gmtime_adj((ASN1_TIME *)pAVar5,0x15180);
      if (pAVar6 != (ASN1_TIME *)0x0) {
        iVar2 = X509_NAME_add_entry_by_txt(name,"CN",0x1001,"Test",-1,-1,0);
        if (iVar2 != 0) {
          pXVar3 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
          iVar2 = X509_set_issuer_name(pXVar3,name);
          if (iVar2 != 0) {
            pXVar3 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
            iVar2 = X509_set_pubkey(pXVar3,(EVP_PKEY *)
                                           x509._M_t.
                                           super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
            if (iVar2 != 0) {
              pXVar3 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&local_20);
              md = EVP_sha256();
              iVar2 = X509_sign(pXVar3,(EVP_PKEY *)
                                       x509._M_t.
                                       super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,md);
              if (iVar2 != 0) {
                std::unique_ptr<x509_st,_bssl::internal::Deleter>::unique_ptr
                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)key,&local_20);
                goto LAB_004ef1d3;
              }
            }
          }
        }
      }
    }
    std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<x509_st,bssl::internal::Deleter> *)key,(nullptr_t)0x0);
  }
  else {
    std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<x509_st,bssl::internal::Deleter> *)key,(nullptr_t)0x0);
  }
LAB_004ef1d3:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)key;
}

Assistant:

static bssl::UniquePtr<X509> MakeTestCert(EVP_PKEY *key) {
  bssl::UniquePtr<X509> x509(X509_new());
  if (!x509) {
    return nullptr;
  }
  X509_NAME* subject = X509_get_subject_name(x509.get());
  if (!X509_gmtime_adj(X509_get_notBefore(x509.get()), 0) ||
      !X509_gmtime_adj(X509_get_notAfter(x509.get()), 60 * 60 * 24) ||
      !X509_NAME_add_entry_by_txt(subject, "CN", MBSTRING_ASC,
                                  reinterpret_cast<const uint8_t *>("Test"), -1,
                                  -1, 0) ||
      !X509_set_issuer_name(x509.get(), subject) ||
      !X509_set_pubkey(x509.get(), key) ||
      !X509_sign(x509.get(), key, EVP_sha256())) {
    return nullptr;
  }
  return x509;
}